

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O1

void duckdb::TestVectorTypesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  reference this;
  type chunk;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  if (pGVar1[4]._vptr_GlobalTableFunctionState <
      (_func_int **)
      ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
       (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3)) {
    this = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                         *)(pGVar1 + 1),(size_type)pGVar1[4]._vptr_GlobalTableFunctionState);
    chunk = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                      (this);
    DataChunk::Reference(output,chunk);
    pGVar1[4]._vptr_GlobalTableFunctionState =
         (_func_int **)((long)pGVar1[4]._vptr_GlobalTableFunctionState + 1);
  }
  return;
}

Assistant:

void TestVectorTypesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<TestVectorTypesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	output.Reference(*data.entries[data.offset]);
	data.offset++;
}